

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

string * __thiscall pegmatite::Input::iterator::filename_abi_cxx11_(iterator *this)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_11;
  
  if ((filename[abi:cxx11]()::None_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&filename[abi:cxx11]()::None_abi_cxx11_), iVar1 != 0)) {
    psVar2 = (string *)operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>((string *)psVar2,"<invalid input>",&local_11)
    ;
    filename[abi:cxx11]()::None_abi_cxx11_ = psVar2;
    __cxa_guard_release(&filename[abi:cxx11]()::None_abi_cxx11_);
  }
  psVar2 = filename[abi:cxx11]()::None_abi_cxx11_;
  if (this->buffer != (Input *)0x0) {
    psVar2 = &this->buffer->user_name;
  }
  return psVar2;
}

Assistant:

const std::string& Input::iterator::filename() const
{
	static std::string& None = *new std::string("<invalid input>");
	return buffer ? buffer->name() : None;
}